

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O1

bool __thiscall Js::AsmJsEncoder::ReadOp(AsmJsEncoder *this)

{
  ByteCodeReader *this_00;
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  OpCodeAsmJs op;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  ByteBlock *this_01;
  LayoutSize local_34 [2];
  LayoutSize layoutSize;
  
  this_00 = &this->mReader;
  uVar4 = ByteCodeReader::GetCurrentOffset(this_00);
  op = ByteCodeReader::ReadOp(this_00,local_34);
  pbVar6 = ByteCodeReader::GetIP(this_00);
  this->ip = pbVar6;
  uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
  pFVar1 = this->mFunctionBody;
  if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00952fcf;
    *puVar7 = 0;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsEncoderPhase,uVar5,
                            ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar3) {
    uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
    pFVar1 = this->mFunctionBody;
    if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_00952fcf;
      *puVar7 = 0;
    }
    Output::Print(L"%d.%d:Encoding ",(ulong)uVar5,
                  (ulong)((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                         )->functionId);
    AsmJsByteCodeDumper::DumpOp(op,local_34[0],this_00,this->mFunctionBody);
    pbVar6 = this->ip;
    pbVar8 = ByteCodeReader::GetIP(this_00);
    if (pbVar6 != pbVar8) {
      ByteCodeReader::SetIP(this_00,this->ip);
    }
    Output::Print(L"  at offset 0x%X (buffer size = 0x%X)\n",(ulong)uVar4,
                  (ulong)(uint)(*(int *)&this->mPc - *(int *)&this->mEncodeBuffer));
    Output::Flush();
  }
  if (op == EndOfBlock) {
    uVar4 = ByteCodeReader::GetCurrentOffset(this_00);
    this_01 = FunctionBody::GetByteCode(this->mFunctionBody);
    uVar5 = ByteBlock::GetLength(this_01);
    if (uVar4 != uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsEncoder.cpp"
                                  ,0x89,
                                  "(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength())"
                                  ,
                                  "mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength()"
                                 );
      if (!bVar3) {
LAB_00952fcf:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  else if (local_34[0] == LargeLayout) {
    ReadOpTemplate<(Js::LayoutSize)2>(this,op);
  }
  else if (local_34[0] == MediumLayout) {
    ReadOpTemplate<(Js::LayoutSize)1>(this,op);
  }
  else if (local_34[0] == SmallLayout) {
    ReadOpTemplate<(Js::LayoutSize)0>(this,op);
  }
  return op != EndOfBlock;
}

Assistant:

bool AsmJsEncoder::ReadOp()
    {
#if DBG_DUMP
        int bytecodeoffset = mReader.GetCurrentOffset();
#endif
        LayoutSize layoutSize;
        OpCodeAsmJs op = (OpCodeAsmJs)mReader.ReadOp(layoutSize);
        ip = mReader.GetIP();
#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsEncoderPhase, mFunctionBody))
        {
            Output::Print(_u("%d.%d:Encoding "),
                           this->mFunctionBody->GetSourceContextId(),
                           this->mFunctionBody->GetLocalFunctionId());
            AsmJsByteCodeDumper::DumpOp( op, layoutSize, mReader, mFunctionBody );
            if( ip != mReader.GetIP() )
            {
                mReader.SetIP( ip );
            }
            Output::Print(_u("  at offset 0x%X (buffer size = 0x%X)\n"),
                           bytecodeoffset, (int)(mPc-mEncodeBuffer));
            Output::Flush();
        }
#endif
        if( op == OpCodeAsmJs::EndOfBlock )
        {
            Assert(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength());
            // last bytecode
            return false;
        }
        switch( layoutSize )
        {
        case Js::SmallLayout:
            ReadOpTemplate<Js::SmallLayout>( op );
            break;
        case Js::MediumLayout:
            ReadOpTemplate<Js::MediumLayout>( op );
            break;
        case Js::LargeLayout:
            ReadOpTemplate<Js::LargeLayout>( op );
            break;
        default:
            break;
        }
        return true;
    }